

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_157::TranslateToExnref::doWalkFunction(TranslateToExnref *this,Function *func)

{
  undefined1 *__src;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  char cVar1;
  Module *pMVar2;
  long lVar3;
  Expression *pEVar4;
  optional<wasm::Type> type;
  undefined8 uVar5;
  undefined8 uVar6;
  Function *pFVar7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  iterator iVar10;
  Return *any;
  Return *append;
  Block *exnref;
  ThrowRef *pTVar11;
  TaskFunc p_Var12;
  char *pcVar13;
  string_view sVar14;
  Signature SVar15;
  string local_1d8;
  undefined1 local_1b8 [224];
  undefined1 auStack_d8 [40];
  undefined1 local_b0 [32];
  undefined1 auStack_90 [24];
  _Rb_tree_node_base *local_78;
  LabelManager *local_70;
  Builder BStack_68;
  Builder builder;
  Function *local_40;
  Function *func_local;
  
  local_40 = func;
  std::_Optional_payload_base<wasm::LabelUtils::LabelManager>::
  _Optional_payload_base<wasm::Function*&>
            ((_Optional_payload_base<wasm::LabelUtils::LabelManager> *)local_1b8,&local_40);
  local_70 = (LabelManager *)&this->labels;
  std::_Optional_payload_base<wasm::LabelUtils::LabelManager>::_M_move_assign
            ((_Optional_payload_base<wasm::LabelUtils::LabelManager> *)local_70,
             (_Optional_payload_base<wasm::LabelUtils::LabelManager> *)local_1b8);
  func_local = (Function *)this;
  std::_Optional_payload_base<wasm::LabelUtils::LabelManager>::_M_reset
            ((_Optional_payload_base<wasm::LabelUtils::LabelManager> *)local_1b8);
  local_1b8._0_8_ = (Expression **)0x0;
  local_1b8._8_8_ = (_Hash_node_base *)0x0;
  local_1b8._192_8_ = (pointer)0x0;
  local_1b8._176_8_ = (pointer)0x0;
  local_1b8._184_8_ = (pointer)0x0;
  local_1b8._208_8_ = (Module *)0x0;
  auStack_d8._16_8_ = auStack_d8;
  auStack_d8._0_8_ = (ulong)(uint)auStack_d8._4_4_ << 0x20;
  auStack_d8._8_8_ = (_Base_ptr)0x0;
  auStack_d8._32_8_ = 0;
  local_b0._24_8_ = local_b0 + 8;
  local_b0._8_8_ = (ulong)(uint)local_b0._12_4_ << 0x20;
  local_b0._16_8_ = (_Base_ptr)0x0;
  auStack_90._8_8_ = (__node_base_ptr)0x0;
  local_1b8._200_8_ = local_40;
  auStack_d8._24_8_ = auStack_d8._16_8_;
  auStack_90._0_8_ = local_b0._24_8_;
  Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
              *)local_1b8,
             PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
             ::scan,&local_40->body);
  __src = local_1b8 + 0x10;
  do {
    pFVar7 = func_local;
    uVar6 = local_1b8._184_8_;
    uVar5 = local_1b8._176_8_;
    if (((long)(local_1b8._184_8_ - local_1b8._176_8_) >> 4) + local_1b8._8_8_ == 0) {
      local_1b8._200_8_ = (Function *)0x0;
      auStack_90[0x10] = true;
      cVar1 = *(char *)&func_local[1].delimiterLocations._M_h._M_single_bucket;
      func_local[1].localNames._M_h._M_bucket_count = local_1b8._0_8_;
      func_local[1].localNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_1b8._8_8_;
      memcpy(&func_local[1].localNames._M_h._M_element_count,__src,0xa0);
      if (cVar1 == '\x01') {
        *(undefined8 *)
         ((long)&pFVar7[1].epilogLocation.
                 super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8) =
             local_1b8._192_8_;
        BStack_68.wasm =
             *(Module **)
              &pFVar7[1].prologLocation.
               super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
               symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged;
        builder.wasm = *(Module **)
                        &pFVar7[1].epilogLocation.
                         super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload;
        *(undefined8 *)
         ((long)&pFVar7[1].prologLocation.
                 super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 0x10) =
             uVar5;
        *(undefined8 *)
         &pFVar7[1].epilogLocation.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload = uVar6;
        local_1b8._176_8_ = (pointer)0x0;
        local_1b8._184_8_ = (pointer)0x0;
        local_1b8._192_8_ = (pointer)0x0;
        std::
        vector<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task>_>
        ::~vector((vector<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task>_>
                   *)&stack0xffffffffffffff98);
        *(undefined8 *)
         &pFVar7[1].epilogLocation.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value
          .symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged = local_1b8._200_8_;
        pFVar7[1].expressionLocations._M_h._M_buckets = (__buckets_ptr)local_1b8._208_8_;
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::operator=((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&pFVar7[1].expressionLocations._M_h._M_bucket_count,
                    (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)(local_1b8 + 0xd8));
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::operator=((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&pFVar7[1].delimiterLocations,
                    (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)local_b0);
      }
      else {
        *(undefined8 *)
         ((long)&pFVar7[1].prologLocation.
                 super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 0x10) =
             uVar5;
        *(undefined8 *)
         &pFVar7[1].epilogLocation.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload = uVar6;
        *(undefined8 *)
         ((long)&pFVar7[1].epilogLocation.
                 super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8) =
             local_1b8._192_8_;
        local_1b8._192_8_ = (pointer)0x0;
        local_1b8._176_8_ = (pointer)0x0;
        local_1b8._184_8_ = (pointer)0x0;
        *(undefined8 *)
         &pFVar7[1].epilogLocation.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value
          .symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged = local_1b8._200_8_;
        pFVar7[1].expressionLocations._M_h._M_buckets = (__buckets_ptr)local_1b8._208_8_;
        std::_Rb_tree_header::_Rb_tree_header
                  ((_Rb_tree_header *)&pFVar7[1].expressionLocations._M_h._M_before_begin,
                   (_Rb_tree_header *)auStack_d8);
        std::_Rb_tree_header::_Rb_tree_header
                  ((_Rb_tree_header *)&pFVar7[1].delimiterLocations._M_h._M_bucket_count,
                   (_Rb_tree_header *)(local_b0 + 8));
        *(undefined1 *)&pFVar7[1].delimiterLocations._M_h._M_single_bucket = 1;
      }
      std::
      _Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
      ::_M_reset((_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
                  *)local_1b8);
      if (*(char *)&pFVar7[1].delimiterLocations._M_h._M_single_bucket == '\0') {
        std::__throw_bad_optional_access();
      }
      local_1b8._216_8_ = &pFVar7[1].localNames._M_h._M_bucket_count;
      local_1b8._0_8_ = (Expression **)0x0;
      local_1b8._8_8_ = (_Hash_node_base *)0x0;
      local_1b8._192_8_ = (pointer)0x0;
      local_1b8._176_8_ = (pointer)0x0;
      local_1b8._184_8_ = (pointer)0x0;
      local_1b8._208_8_ = (Module *)0x0;
      auStack_d8._0_8_ = (pointer)0x0;
      auStack_d8._8_8_ = (_Base_ptr)0x0;
      auStack_d8._16_8_ = (_Base_ptr)0x0;
      auStack_d8._24_8_ = auStack_90;
      auStack_d8._32_8_ = 1;
      local_b0._0_8_ = (_Hash_node_base *)0x0;
      local_b0._8_8_ = 0;
      local_b0._16_4_ = 1.0;
      auStack_90._8_8_ = (__node_base_ptr)0x0;
      local_b0._24_8_ = (_Base_ptr)0x0;
      auStack_90._0_8_ = (_Base_ptr)0x0;
      local_1b8._200_8_ = local_40;
      Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
                  *)local_1b8,ExnrefLocalAssigner::scan,&local_40->body);
      do {
        pFVar7 = func_local;
        uVar6 = local_1b8._184_8_;
        uVar5 = local_1b8._176_8_;
        if (((long)(local_1b8._184_8_ - local_1b8._176_8_) >> 4) + local_1b8._8_8_ == 0) {
          local_1b8._200_8_ = (Function *)0x0;
          auStack_90[0x10] = true;
          cVar1 = *(char *)&func_local[2].prologLocation.
                            super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
                            _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                            _M_payload;
          func_local[1].funcLocation.start = local_1b8._0_4_;
          func_local[1].funcLocation.declarations = local_1b8._4_4_;
          *(undefined8 *)&func_local[1].funcLocation.end = local_1b8._8_8_;
          memcpy(&func_local[1].effects,__src,0xa0);
          if (cVar1 == '\x01') {
            pFVar7[2].localNames._M_h._M_single_bucket = (__node_base_ptr)local_1b8._192_8_;
            BStack_68.wasm = *(Module **)&pFVar7[2].localNames._M_h._M_rehash_policy;
            builder.wasm = (Module *)pFVar7[2].localNames._M_h._M_rehash_policy._M_next_resize;
            *(undefined8 *)&pFVar7[2].localNames._M_h._M_rehash_policy = uVar5;
            pFVar7[2].localNames._M_h._M_rehash_policy._M_next_resize = uVar6;
            local_1b8._176_8_ = (pointer)0x0;
            local_1b8._184_8_ = (pointer)0x0;
            local_1b8._192_8_ = (pointer)0x0;
            std::
            vector<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task>_>
            ::~vector((vector<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task>_>
                       *)&stack0xffffffffffffff98);
            *(undefined4 *)&pFVar7[2].localIndices._M_h._M_buckets = local_1b8._200_4_;
            *(undefined4 *)((long)&pFVar7[2].localIndices._M_h._M_buckets + 4) = local_1b8._204_4_;
            *(undefined4 *)&pFVar7[2].localIndices._M_h._M_bucket_count = local_1b8._208_4_;
            *(undefined4 *)((long)&pFVar7[2].localIndices._M_h._M_bucket_count + 4) =
                 local_1b8._212_4_;
            pFVar7[2].localIndices._M_h._M_before_begin._M_nxt =
                 (_Hash_node_base *)local_1b8._216_8_;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &pFVar7[2].localIndices._M_h._M_element_count,auStack_d8);
            std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::operator=((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&pFVar7[2].localIndices._M_h._M_single_bucket,
                        (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)(auStack_d8 + 0x18));
          }
          else {
            *(undefined8 *)&pFVar7[2].localNames._M_h._M_rehash_policy = uVar5;
            pFVar7[2].localNames._M_h._M_rehash_policy._M_next_resize = uVar6;
            pFVar7[2].localNames._M_h._M_single_bucket = (__node_base_ptr)local_1b8._192_8_;
            local_1b8._192_8_ = (pointer)0x0;
            local_1b8._176_8_ = (pointer)0x0;
            local_1b8._184_8_ = (pointer)0x0;
            pFVar7[2].localIndices._M_h._M_buckets = (__buckets_ptr)local_1b8._200_8_;
            pFVar7[2].localIndices._M_h._M_bucket_count = local_1b8._208_8_;
            pFVar7[2].localIndices._M_h._M_before_begin._M_nxt =
                 (_Hash_node_base *)local_1b8._216_8_;
            pFVar7[2].localIndices._M_h._M_element_count = auStack_d8._0_8_;
            *(undefined8 *)&pFVar7[2].localIndices._M_h._M_rehash_policy = auStack_d8._8_8_;
            pFVar7[2].localIndices._M_h._M_rehash_policy._M_next_resize = auStack_d8._16_8_;
            auStack_d8._0_8_ = (pointer)0x0;
            auStack_d8._8_8_ = (_Base_ptr)0x0;
            auStack_d8._16_8_ = (_Base_ptr)0x0;
            std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&pFVar7[2].localIndices._M_h._M_single_bucket,
                         (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)(auStack_d8 + 0x18));
            *(undefined1 *)
             &pFVar7[2].prologLocation.
              super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload = 1;
          }
          pFVar7[2].debugLocations._M_h._M_single_bucket = (__node_base_ptr)auStack_90._8_8_;
          std::
          _Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
          ::_M_reset((_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
                      *)local_1b8);
          local_78 = (_Rb_tree_node_base *)&pFVar7[1].expressionLocations._M_h._M_before_begin;
          this_00 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((long)&pFVar7[2].prologLocation.
                               super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<wasm::Function::DebugLocation>.
                               _M_payload + 8);
          for (p_Var9 = *(_Rb_tree_node_base **)&pFVar7[1].expressionLocations._M_h._M_rehash_policy
              ; pFVar7 = func_local, p_Var9 != local_78;
              p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
            IString::toString_abi_cxx11_(&local_1d8,(IString *)(p_Var9 + 1));
            sVar14 = (string_view)LabelUtils::LabelManager::getUnique(local_70,&local_1d8);
            pmVar8 = std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)this_00,(key_type *)(p_Var9 + 1));
            (pmVar8->super_IString).str = sVar14;
            std::__cxx11::string::~string((string *)&local_1d8);
          }
          Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
          ::walk((Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
                  *)&(func_local->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,&local_40->body);
          iVar10 = std::
                   _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_00,(key_type *)&DELEGATE_CALLER_TARGET);
          if (iVar10.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>._M_cur
              != (__node_type *)0x0) {
            pmVar8 = std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)this_00,(key_type *)&DELEGATE_CALLER_TARGET);
            sVar14 = (pmVar8->super_IString).str;
            pMVar2 = *(Module **)
                      &(pFVar7->epilogLocation).
                       super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload;
            lVar3 = *(long *)((long)&(pFVar7->prologLocation).
                                     super__Optional_base<wasm::Function::DebugLocation,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<wasm::Function::DebugLocation>.
                                     _M_payload + 0x10);
            BStack_68.wasm = pMVar2;
            SVar15 = HeapType::getSignature((HeapType *)(lVar3 + 0x38));
            if (SVar15.results.id.id < 2) {
              append = MixedArena::alloc<wasm::Return>(&pMVar2->allocator);
              append->value = (Expression *)0x0;
              any = *(Return **)(lVar3 + 0x60);
            }
            else {
              pEVar4 = *(Expression **)(lVar3 + 0x60);
              any = MixedArena::alloc<wasm::Return>(&pMVar2->allocator);
              any->value = pEVar4;
              append = (Return *)0x0;
            }
            local_1b8[8] = 1;
            local_1b8._0_8_ = (Expression **)0x4a;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = local_1b8._8_8_;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)0x4a;
            exnref = Builder::blockifyWithName
                               (&stack0xffffffffffffff98,(Expression *)any,(Name)sVar14,
                                (Expression *)append,type);
            pTVar11 = Builder::makeThrowRef(&stack0xffffffffffffff98,(Expression *)exnref);
            *(ThrowRef **)(lVar3 + 0x60) = pTVar11;
          }
          return;
        }
        if (local_1b8._176_8_ == local_1b8._184_8_) {
          if ((_Hash_node_base *)local_1b8._8_8_ == (_Hash_node_base *)0x0) {
            pcVar13 = 
            "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>>::Task, N = 10]"
            ;
LAB_00bebdab:
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x7e,pcVar13);
          }
          local_1b8._8_8_ = local_1b8._8_8_ - 1;
          p_Var12 = *(TaskFunc *)(__src + local_1b8._8_8_ * 0x10);
          local_1b8._0_8_ = *(undefined8 *)(local_1b8 + local_1b8._8_8_ * 0x10 + 0x18);
        }
        else {
          p_Var12 = ((pointer)(local_1b8._184_8_ + -0x10))->func;
          local_1b8._0_8_ = ((pointer)(local_1b8._184_8_ + -0x10))->currp;
          local_1b8._184_8_ = (pointer)(local_1b8._184_8_ + -0x10);
        }
        if (*(Expression **)local_1b8._0_8_ == (Expression *)0x0) {
          pcVar13 = 
          "void wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>]"
          ;
LAB_00bebd75:
          __assert_fail("*task.currp",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                        ,0x132,pcVar13);
        }
        (*p_Var12)((ExnrefLocalAssigner *)local_1b8,(Expression **)local_1b8._0_8_);
      } while( true );
    }
    if (local_1b8._176_8_ == local_1b8._184_8_) {
      if ((_Hash_node_base *)local_1b8._8_8_ == (_Hash_node_base *)0x0) {
        pcVar13 = 
        "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>>::Task, N = 10]"
        ;
        goto LAB_00bebdab;
      }
      local_1b8._8_8_ = local_1b8._8_8_ - 1;
      p_Var12 = *(TaskFunc *)(__src + local_1b8._8_8_ * 0x10);
      local_1b8._0_8_ = *(undefined8 *)(local_1b8 + local_1b8._8_8_ * 0x10 + 0x18);
    }
    else {
      p_Var12 = ((pointer)(local_1b8._184_8_ + -0x10))->func;
      local_1b8._0_8_ = ((pointer)(local_1b8._184_8_ + -0x10))->currp;
      local_1b8._184_8_ = (pointer)(local_1b8._184_8_ + -0x10);
    }
    if (*(Expression **)local_1b8._0_8_ == (Expression *)0x0) {
      pcVar13 = 
      "void wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>]"
      ;
      goto LAB_00bebd75;
    }
    (*p_Var12)((ExnrefLocalAssigner *)local_1b8,(Expression **)local_1b8._0_8_);
  } while( true );
}

Assistant:

void doWalkFunction(Function* func) {
    labels = std::make_optional<LabelUtils::LabelManager>(func);
    labelScanner = std::make_optional<TargetTryLabelScanner>(func);
    localAssigner =
      std::make_optional<ExnrefLocalAssigner>(func, &labelScanner.value());

    // Create a unique br target label for each existing delegate target label,
    // because we are going to achieve 'delegate's effects with 'br's. See
    // processDelegateTarget() for details.
    for (auto& target : labelScanner->delegateTargets) {
      delegateTargetToTrampoline[target] = labels->getUnique(target.toString());
    }

    Super::doWalkFunction(func);

    // Similar to processDelegateTarget(), but for the caller target.
    if (delegateTargetToTrampoline.find(DELEGATE_CALLER_TARGET) !=
        delegateTargetToTrampoline.end()) {
      processCallerDelegateTarget();
    }
  }